

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OledI2C.cxx
# Opt level: O2

void __thiscall SSD1306::OledI2C::fillWith(OledI2C *this,uint8_t value)

{
  uchar *puVar1;
  long lVar2;
  long lVar3;
  
  puVar1 = (this->blocks_)._M_elems[0].bytes_._M_elems + 1;
  for (lVar2 = 0x38; lVar2 != 0x478; lVar2 = lVar2 + 0x22) {
    for (lVar3 = 0; lVar3 != 0x20; lVar3 = lVar3 + 1) {
      if ((puVar1[lVar3] != value) &&
         (puVar1[lVar3] = value, (this->blocks_)._M_elems[0].bytes_._M_elems[lVar2 + -0x17] == '\0')
         ) {
        (this->blocks_)._M_elems[0].bytes_._M_elems[lVar2 + -0x17] = '\x01';
      }
    }
    puVar1 = puVar1 + 0x22;
  }
  return;
}

Assistant:

void
SSD1306::OledI2C::fillWith(
    uint8_t value)
{
    for (auto& block : blocks_)
    {
        auto& bytes = block.bytes_;

        for (auto byte = bytes.begin() + SSD1306::OledI2C::DataOffset ; 
             byte != bytes.end() ;
             ++byte)
        {
            if (*byte != value)
            {
                *byte = value;

                if (not block.dirty_)
                {
                    block.dirty_ = true;
                }
            }
        }
    }
}